

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::switch_storage_to_map
          (subscriber_adaptive_container_t *this)

{
  iterator __first;
  iterator __last;
  undefined1 local_58 [8];
  map_type new_storage;
  vector_type empty_vector;
  subscriber_adaptive_container_t *this_local;
  
  std::
  vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ::vector((vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
            *)&new_storage._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<so_5::agent_t_*,_so_5::impl::local_mbox_details::subscriber_info_t,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::map((map_type *)local_58);
  __first = std::
            vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
            ::begin(&this->m_vector);
  __last = std::
           vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ::end(&this->m_vector);
  std::
  for_each<__gnu_cxx::__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t*,std::vector<so_5::impl::local_mbox_details::subscriber_info_t,std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>>>,so_5::impl::local_mbox_details::subscriber_adaptive_container_t::switch_storage_to_map()::_lambda(so_5::impl::local_mbox_details::subscriber_info_t_const&)_1_>
            ((__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
              )__first._M_current,
             (__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
              )__last._M_current,(map_type *)local_58);
  std::
  map<so_5::agent_t_*,_so_5::impl::local_mbox_details::subscriber_info_t,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::swap(&this->m_map,
         (map<so_5::agent_t_*,_so_5::impl::local_mbox_details::subscriber_info_t,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
          *)local_58);
  std::
  vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ::swap(&this->m_vector,
         (vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
          *)&new_storage._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this->m_storage = map;
  std::
  map<so_5::agent_t_*,_so_5::impl::local_mbox_details::subscriber_info_t,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::~map((map<so_5::agent_t_*,_so_5::impl::local_mbox_details::subscriber_info_t,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
          *)local_58);
  std::
  vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ::~vector((vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
             *)&new_storage._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void
	switch_storage_to_map()
		{
			vector_type empty_vector;

			map_type new_storage;
			std::for_each( m_vector.begin(), m_vector.end(),
				[&new_storage]( const subscriber_info_t & info ) {
					new_storage.emplace( info.subscriber_pointer(), info );
				} );

			m_map.swap( new_storage );
			m_vector.swap( empty_vector );
			m_storage = storage_type::map;
		}